

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::LiteralString(Rune *runes,int nrunes,ParseFlags flags)

{
  int in_ESI;
  int i;
  Regexp *re;
  undefined8 in_stack_ffffffffffffffb8;
  Regexp *in_stack_ffffffffffffffc0;
  undefined4 local_34;
  undefined8 in_stack_ffffffffffffffd0;
  Rune in_stack_ffffffffffffffdc;
  Regexp *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  if (in_ESI < 1) {
    local_8 = (Regexp *)operator_new(0x28);
    Regexp(local_8,(RegexpOp)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
           (ParseFlags)in_stack_ffffffffffffffb8);
  }
  else if (in_ESI == 1) {
    local_8 = NewLiteral((Rune)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                         (ParseFlags)in_stack_ffffffffffffffd0);
  }
  else {
    local_8 = (Regexp *)operator_new(0x28);
    Regexp(in_stack_ffffffffffffffc0,(RegexpOp)((ulong)local_8 >> 0x20),(ParseFlags)local_8);
    for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
      AddRuneToString(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    }
  }
  return local_8;
}

Assistant:

Regexp* Regexp::LiteralString(Rune* runes, int nrunes, ParseFlags flags) {
  if (nrunes <= 0)
    return new Regexp(kRegexpEmptyMatch, flags);
  if (nrunes == 1)
    return NewLiteral(runes[0], flags);
  Regexp* re = new Regexp(kRegexpLiteralString, flags);
  for (int i = 0; i < nrunes; i++)
    re->AddRuneToString(runes[i]);
  return re;
}